

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

e_int32 calc_slot_hat(OPLL_SLOT *slot,e_int32 pgout_cym,e_uint32 noise)

{
  int local_24;
  e_uint32 dbout;
  e_uint32 noise_local;
  e_int32 pgout_cym_local;
  OPLL_SLOT *slot_local;
  
  if (slot->egout < 0xff) {
    if ((slot->pgout >> 1 & 1 ^ slot->pgout >> 8 & 1 | slot->pgout >> 2 & 1) ==
        (pgout_cym >> 2 & 1U & (uint)((pgout_cym >> 4 & 1U) == 0))) {
      if (noise == 0) {
        local_24 = 0x80;
      }
      else {
        local_24 = 0x40;
      }
    }
    else if (noise == 0) {
      local_24 = 0x280;
    }
    else {
      local_24 = 0x240;
    }
    slot_local._4_4_ = (int)DB2LIN_TABLE[local_24 + slot->egout];
  }
  else {
    slot_local._4_4_ = 0;
  }
  return slot_local._4_4_;
}

Assistant:

INLINE static e_int32
calc_slot_hat (OPLL_SLOT *slot, e_int32 pgout_cym, e_uint32 noise)
{
  e_uint32 dbout;

  if (slot->egout >= (DB_MUTE - 1)) 
    return 0;
  else if( 
      /* the same as fmopl.c */
      ((BIT(slot->pgout,PG_BITS-8)^BIT(slot->pgout,PG_BITS-1))|BIT(slot->pgout,PG_BITS-7)) ^
      /* different from fmopl.c */
      (BIT(pgout_cym,PG_BITS-7)&!BIT(pgout_cym,PG_BITS-5))
    )
  {
    if(noise)
      dbout = DB_NEG(12.0);
    else
      dbout = DB_NEG(24.0);
  }
  else
  {
    if(noise)
      dbout = DB_POS(12.0);
    else
      dbout = DB_POS(24.0);
  }

  return DB2LIN_TABLE[dbout + slot->egout];
}